

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxmainsm.hpp
# Opt level: O0

Result __thiscall
soplex::
SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::simplifyDual(SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *this,SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     *lp,bool *again)

{
  SPxOut *pSVar1;
  uint uVar2;
  undefined4 uVar3;
  type_conflict5 tVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  Verbosity VVar10;
  ulong *puVar11;
  SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar12;
  int *piVar13;
  char *pcVar14;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar15;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar16;
  int __c;
  int __c_00;
  undefined1 *in_RDX;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_RSI;
  SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_RDI;
  Verbosity old_verbosity_2;
  shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>
  ptr_4;
  shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>
  ptr_3;
  shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>
  ptr_2;
  Verbosity old_verbosity_1;
  shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>
  ptr_1;
  Verbosity old_verbosity;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  obj;
  int j_2;
  int i_2;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  aij_1;
  int k;
  SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *col;
  int j_1;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  bound;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  aij;
  int i_1;
  int j;
  shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>
  ptr;
  int i;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  dualConsUp;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  dualConsLo;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  dualVarUp;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  dualVarLo;
  DataArray<bool> colSingleton;
  int oldCols;
  int oldRows;
  int remNzos;
  int remCols;
  int remRows;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_4;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_4;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_3;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_3;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_2;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_2;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_1;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_1;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_5;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_5;
  undefined4 in_stack_ffffffffffffe6f8;
  int in_stack_ffffffffffffe6fc;
  undefined4 in_stack_ffffffffffffe700;
  int in_stack_ffffffffffffe704;
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_ffffffffffffe708;
  SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_ffffffffffffe710;
  self_type *in_stack_ffffffffffffe718;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_ffffffffffffe720;
  SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_ffffffffffffe738;
  shared_ptr<soplex::Tolerances> *in_stack_ffffffffffffe748;
  int in_stack_ffffffffffffe754;
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_ffffffffffffe758;
  FreeConstraintPS *in_stack_ffffffffffffe760;
  double in_stack_ffffffffffffe780;
  cpp_dec_float<50U,_int,_void> *in_stack_ffffffffffffe788;
  undefined5 in_stack_ffffffffffffe7b0;
  undefined1 in_stack_ffffffffffffe7b5;
  undefined1 in_stack_ffffffffffffe7b6;
  undefined1 in_stack_ffffffffffffe7b7;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_ffffffffffffe7b8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_ffffffffffffe7c0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_ffffffffffffe7e0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_ffffffffffffe7e8;
  undefined4 in_stack_ffffffffffffe7f0;
  int in_stack_ffffffffffffe7f4;
  bool local_17f2;
  type_conflict5 local_165a;
  type_conflict5 local_162a;
  type_conflict5 local_161a;
  type_conflict5 local_160a;
  type_conflict5 local_15fa;
  undefined4 in_stack_ffffffffffffea40;
  undefined4 in_stack_ffffffffffffea4c;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_ffffffffffffea50;
  undefined7 in_stack_ffffffffffffea58;
  undefined1 in_stack_ffffffffffffea5f;
  FixBoundsPS *in_stack_ffffffffffffea60;
  type_conflict5 local_155a;
  int local_1534;
  int local_1530 [14];
  int local_14f8;
  undefined4 local_14f4;
  Verbosity local_14f0 [15];
  undefined1 local_14b4 [56];
  undefined1 local_147c [59];
  undefined1 local_1441;
  undefined1 local_1430 [128];
  undefined1 local_13b0 [56];
  undefined1 local_1378 [56];
  ulong local_1340;
  undefined1 local_1334 [59];
  undefined1 local_12f9;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_12f8 [2];
  undefined1 local_1264 [56];
  undefined1 local_122c [56];
  undefined1 local_11f4 [59];
  undefined1 local_11b9;
  undefined1 local_11a8 [72];
  undefined1 local_1160 [3];
  int in_stack_ffffffffffffeea4;
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_ffffffffffffeea8;
  SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_ffffffffffffeeb0;
  undefined1 local_10dc [56];
  undefined1 local_10a4 [59];
  undefined1 local_1069;
  undefined1 local_1058 [72];
  undefined4 local_1010;
  Verbosity local_100c;
  undefined1 local_1008 [112];
  undefined1 local_f98 [56];
  undefined1 local_f60 [56];
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_f28;
  undefined4 local_ef0;
  undefined1 local_eb4 [56];
  undefined1 local_e7c [56];
  int local_e44;
  undefined1 local_e40 [56];
  ulong local_e08;
  undefined1 local_e00 [56];
  undefined1 local_dc8 [56];
  undefined1 local_d90 [56];
  undefined1 local_d58 [56];
  ulong local_d20;
  undefined1 local_d14 [56];
  undefined4 local_cdc;
  undefined1 local_cd8 [56];
  undefined1 local_ca0 [56];
  undefined1 local_c68 [56];
  undefined1 local_c30 [56];
  ulong local_bf8;
  undefined1 local_bf0 [56];
  ulong local_bb8;
  undefined1 local_bb0 [56];
  undefined4 local_b78;
  undefined4 local_b74;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_b70;
  undefined1 local_b38 [56];
  ulong local_b00;
  undefined1 local_af4 [56];
  uint local_abc;
  SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_ab8;
  undefined8 local_ab0;
  int local_aa4;
  undefined1 local_aa0 [56];
  ulong local_a68;
  undefined1 local_a5c [56];
  undefined4 local_a24;
  undefined1 local_a20 [56];
  ulong local_9e8;
  undefined1 local_9dc [56];
  undefined4 local_9a4;
  undefined1 local_9a0 [56];
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_968;
  undefined4 local_930;
  int local_92c;
  undefined8 local_928;
  undefined1 local_920 [56];
  undefined1 local_8e8 [56];
  ulong local_8b0 [3];
  undefined1 local_894 [56];
  undefined1 local_85c [59];
  undefined1 local_821;
  undefined1 local_800 [56];
  ulong local_7c8;
  undefined1 local_7bc [56];
  int local_784 [36];
  int local_6f4;
  int local_6f0;
  int local_6ec;
  int local_6e8;
  int local_6e4;
  undefined1 *local_6e0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_6d8;
  Result local_6c4;
  undefined8 local_6c0;
  ulong *local_6b8;
  undefined1 *local_6b0;
  undefined8 local_6a8;
  undefined8 local_6a0;
  undefined1 *local_698;
  undefined8 local_690;
  ulong *local_688;
  undefined1 *local_680;
  undefined8 local_678;
  ulong *local_670;
  undefined1 *local_668;
  undefined8 local_660;
  ulong *local_658;
  undefined1 *local_650;
  undefined8 local_648;
  undefined8 local_640;
  undefined1 *local_638;
  undefined8 local_630;
  undefined8 *local_628;
  undefined1 *local_620;
  undefined8 local_618;
  undefined8 local_610;
  undefined1 *local_608;
  undefined8 local_600;
  ulong *local_5f8;
  undefined1 *local_5f0;
  undefined8 local_5e8;
  undefined8 local_5e0;
  undefined1 *local_5d8;
  undefined8 local_5d0;
  ulong *local_5c8;
  undefined1 *local_5c0;
  undefined8 local_5b8;
  undefined8 local_5b0;
  undefined1 *local_5a8;
  undefined8 local_5a0;
  ulong *local_598;
  undefined1 *local_590;
  undefined8 local_588;
  undefined8 local_580;
  undefined1 *local_578;
  undefined8 local_570;
  ulong *local_568;
  undefined1 *local_560;
  undefined8 local_558;
  ulong *local_550;
  undefined1 *local_548;
  undefined8 local_540;
  undefined8 local_538;
  undefined1 *local_530;
  undefined8 local_528;
  undefined8 local_520;
  undefined1 *local_518;
  undefined8 local_510;
  ulong *local_508;
  undefined1 *local_500;
  undefined8 local_4f8;
  undefined8 local_4f0;
  undefined1 *local_4e8;
  undefined8 local_4e0;
  undefined8 local_4d8;
  undefined1 *local_4d0;
  undefined8 local_4c8;
  ulong *local_4c0;
  undefined1 *local_4b8;
  undefined8 local_4b0;
  undefined8 local_4a8;
  undefined1 *local_4a0;
  undefined8 local_498;
  undefined1 *local_490;
  undefined1 *local_488;
  undefined8 local_480;
  undefined8 local_478;
  undefined1 *local_470;
  undefined8 local_468;
  ulong *local_460;
  undefined1 *local_458;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_450;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_448;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_440;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_438;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_430;
  undefined1 *local_428;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_420;
  undefined1 *local_418;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_410;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_408;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_400;
  undefined1 *local_3f8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_3f0;
  undefined1 *local_3e8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_3e0;
  undefined1 *local_3d8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_3d0;
  undefined1 *local_3c8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_3c0;
  undefined1 *local_3b8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_3b0;
  undefined1 *local_3a8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_3a0;
  undefined1 *local_398;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_390;
  undefined1 *local_388;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_380;
  uint *local_378;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_370;
  undefined1 *local_368;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_360;
  undefined1 *local_358;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_350;
  undefined1 *local_348;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_340;
  undefined1 *local_338;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_330;
  undefined1 *local_328;
  undefined1 *local_320;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_318;
  undefined1 *local_310;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_308;
  undefined1 *local_300;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_2f8;
  undefined1 *local_2f0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_2e8;
  undefined1 *local_2e0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_2d8;
  undefined1 *local_2d0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_2c8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_2c0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_2b8;
  undefined1 *local_2b0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_2a8;
  undefined1 *local_2a0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_298;
  undefined1 *local_290;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_288;
  undefined1 *local_280;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_278;
  ulong *local_270;
  undefined8 local_268;
  undefined1 *local_260;
  undefined8 local_258;
  ulong *local_250;
  undefined8 local_248;
  undefined8 local_240;
  ulong *local_238;
  undefined8 local_230;
  undefined8 local_228;
  ulong *local_220;
  ulong *local_218;
  undefined8 local_210;
  ulong *local_208;
  undefined8 local_200;
  ulong *local_1f8;
  undefined8 local_1f0;
  ulong *local_1e8;
  undefined8 local_1e0;
  undefined8 *local_1d8;
  undefined8 local_1d0;
  ulong *local_1c8;
  ulong *local_1c0;
  ulong *local_1b8;
  undefined8 local_1b0;
  ulong *local_1a8;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_199;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_198;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_190;
  undefined1 *local_188;
  undefined1 *local_180;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_178;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_170;
  undefined1 *local_168;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_159;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_158;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_150;
  undefined1 *local_148;
  undefined1 *local_140;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_138;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_130;
  undefined1 *local_128;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_119;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_118;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_110;
  undefined1 *local_108;
  undefined1 *local_100;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_f8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_f0;
  undefined1 *local_e8;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_d9;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_d8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_d0;
  undefined1 *local_c8;
  undefined1 *local_c0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_b8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_b0;
  undefined1 *local_a8;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_99;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_98;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_90;
  undefined1 *local_88;
  undefined1 *local_80;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_78;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_70;
  undefined1 *local_68;
  undefined8 *local_60;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_58;
  undefined8 *local_50;
  long local_48;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_39;
  int *local_38;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_30;
  int *local_28;
  int *local_20;
  int *local_18;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_10;
  int *local_8;
  
  local_6e4 = 0;
  local_6e8 = 0;
  local_6ec = 0;
  local_6e0 = in_RDX;
  local_6d8 = in_RSI;
  local_6f0 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::nRows((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       *)0x3d6b6d);
  local_6f4 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::nCols((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       *)0x3d6b81);
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::nCols((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *)0x3d6b95);
  DataArray<bool>::DataArray
            ((DataArray<bool> *)in_stack_ffffffffffffe710,
             (int)((ulong)in_stack_ffffffffffffe708 >> 0x20),(int)in_stack_ffffffffffffe708,
             (Real)CONCAT44(in_stack_ffffffffffffe704,in_stack_ffffffffffffe700));
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::nRows((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *)0x3d6bbb);
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::VectorBase((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *)in_stack_ffffffffffffe710,(int)((ulong)in_stack_ffffffffffffe708 >> 0x20));
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::nRows((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *)0x3d6be7);
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::VectorBase((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *)in_stack_ffffffffffffe710,(int)((ulong)in_stack_ffffffffffffe708 >> 0x20));
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::nCols((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *)0x3d6c13);
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::VectorBase((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *)in_stack_ffffffffffffe710,(int)((ulong)in_stack_ffffffffffffe708 >> 0x20));
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::nCols((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *)0x3d6c3f);
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::VectorBase((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *)in_stack_ffffffffffffe710,(int)((ulong)in_stack_ffffffffffffe708 >> 0x20));
  local_784[0] = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ::nRows((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          *)0x3d6c6b);
  while (local_784[0] = local_784[0] + -1, -1 < local_784[0]) {
    SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::lhs((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *)CONCAT44(in_stack_ffffffffffffe704,in_stack_ffffffffffffe700),in_stack_ffffffffffffe6fc
         );
    puVar11 = (ulong *)infinity();
    local_7c8 = *puVar11 ^ 0x8000000000000000;
    local_6b0 = local_7bc;
    local_6b8 = &local_7c8;
    local_6c0 = 0;
    local_1a8 = local_6b8;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
              ((cpp_dec_float<50U,_int,_void> *)in_stack_ffffffffffffe710,
               (double)in_stack_ffffffffffffe708,
               (type *)CONCAT44(in_stack_ffffffffffffe704,in_stack_ffffffffffffe700));
    tVar4 = boost::multiprecision::operator<=
                      ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)CONCAT44(in_stack_ffffffffffffe6fc,in_stack_ffffffffffffe6f8),
                       (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)0x3d6d40);
    local_155a = false;
    if (tVar4) {
      SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::rhs((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             *)CONCAT44(in_stack_ffffffffffffe704,in_stack_ffffffffffffe700),
            in_stack_ffffffffffffe6fc);
      local_6a0 = infinity();
      local_698 = local_800;
      local_6a8 = 0;
      local_1b0 = local_6a0;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                ((cpp_dec_float<50U,_int,_void> *)in_stack_ffffffffffffe710,
                 (double)in_stack_ffffffffffffe708,
                 (type *)CONCAT44(in_stack_ffffffffffffe704,in_stack_ffffffffffffe700));
      local_155a = boost::multiprecision::operator>=
                             ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                               *)CONCAT44(in_stack_ffffffffffffe6fc,in_stack_ffffffffffffe6f8),
                              (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                               *)0x3d6df0);
    }
    if (local_155a == false) {
      in_stack_ffffffffffffea60 =
           (FixBoundsPS *)
           SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ::lhs((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  *)CONCAT44(in_stack_ffffffffffffe704,in_stack_ffffffffffffe700),
                 in_stack_ffffffffffffe6fc);
      puVar11 = (ulong *)infinity();
      local_8b0[2] = *puVar11 ^ 0x8000000000000000;
      local_680 = local_894;
      local_688 = local_8b0 + 2;
      local_690 = 0;
      local_1b8 = local_688;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                ((cpp_dec_float<50U,_int,_void> *)in_stack_ffffffffffffe710,
                 (double)in_stack_ffffffffffffe708,
                 (type *)CONCAT44(in_stack_ffffffffffffe704,in_stack_ffffffffffffe700));
      in_stack_ffffffffffffea5f =
           boost::multiprecision::operator<=
                     ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)CONCAT44(in_stack_ffffffffffffe6fc,in_stack_ffffffffffffe6f8),
                      (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)0x3d7136);
      if ((bool)in_stack_ffffffffffffea5f) {
        local_8b0[1] = 0;
        local_668 = local_85c;
        local_670 = local_8b0 + 1;
        local_678 = 0;
        local_1c0 = local_670;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                  ((cpp_dec_float<50U,_int,_void> *)in_stack_ffffffffffffe710,
                   (double)in_stack_ffffffffffffe708,
                   (type *)CONCAT44(in_stack_ffffffffffffe704,in_stack_ffffffffffffe700));
      }
      else {
        puVar11 = (ulong *)infinity();
        local_8b0[0] = *puVar11 ^ 0x8000000000000000;
        local_650 = local_85c;
        local_658 = local_8b0;
        local_660 = 0;
        local_1c8 = local_658;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                  ((cpp_dec_float<50U,_int,_void> *)in_stack_ffffffffffffe710,
                   (double)in_stack_ffffffffffffe708,
                   (type *)CONCAT44(in_stack_ffffffffffffe704,in_stack_ffffffffffffe700));
      }
      local_2c8 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                *)CONCAT44(in_stack_ffffffffffffe704,in_stack_ffffffffffffe700),
                               in_stack_ffffffffffffe6fc);
      local_2d0 = local_85c;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                ((cpp_dec_float<50U,_int,_void> *)
                 CONCAT44(in_stack_ffffffffffffe704,in_stack_ffffffffffffe700),
                 (cpp_dec_float<50U,_int,_void> *)
                 CONCAT44(in_stack_ffffffffffffe6fc,in_stack_ffffffffffffe6f8));
      in_stack_ffffffffffffea50 =
           SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ::rhs((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  *)CONCAT44(in_stack_ffffffffffffe704,in_stack_ffffffffffffe700),
                 in_stack_ffffffffffffe6fc);
      local_640 = infinity();
      local_638 = local_920;
      local_648 = 0;
      local_1d0 = local_640;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                ((cpp_dec_float<50U,_int,_void> *)in_stack_ffffffffffffe710,
                 (double)in_stack_ffffffffffffe708,
                 (type *)CONCAT44(in_stack_ffffffffffffe704,in_stack_ffffffffffffe700));
      tVar4 = boost::multiprecision::operator>=
                        ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)CONCAT44(in_stack_ffffffffffffe6fc,in_stack_ffffffffffffe6f8),
                         (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)0x3d7301);
      in_stack_ffffffffffffea4c = CONCAT13(tVar4,(int3)in_stack_ffffffffffffea4c);
      if (tVar4) {
        local_928 = 0;
        local_620 = local_8e8;
        local_628 = &local_928;
        local_630 = 0;
        local_1d8 = local_628;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                  ((cpp_dec_float<50U,_int,_void> *)in_stack_ffffffffffffe710,
                   (double)in_stack_ffffffffffffe708,
                   (type *)CONCAT44(in_stack_ffffffffffffe704,in_stack_ffffffffffffe700));
      }
      else {
        local_610 = infinity();
        local_608 = local_8e8;
        local_618 = 0;
        local_1e0 = local_610;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                  ((cpp_dec_float<50U,_int,_void> *)in_stack_ffffffffffffe710,
                   (double)in_stack_ffffffffffffe708,
                   (type *)CONCAT44(in_stack_ffffffffffffe704,in_stack_ffffffffffffe700));
      }
      local_2d8 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                *)CONCAT44(in_stack_ffffffffffffe704,in_stack_ffffffffffffe700),
                               in_stack_ffffffffffffe6fc);
      local_2e0 = local_8e8;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                ((cpp_dec_float<50U,_int,_void> *)
                 CONCAT44(in_stack_ffffffffffffe704,in_stack_ffffffffffffe700),
                 (cpp_dec_float<50U,_int,_void> *)
                 CONCAT44(in_stack_ffffffffffffe6fc,in_stack_ffffffffffffe6f8));
    }
    else {
      SPxOut::
      debug<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_const_char_(&)[32],_int_&,_0>
                (in_RDI,(char (*) [32])"IMAISM43 row {}: unconstrained\n",local_784);
      operator_new(0x88);
      local_821 = 1;
      std::shared_ptr<soplex::Tolerances>::shared_ptr
                ((shared_ptr<soplex::Tolerances> *)
                 CONCAT44(in_stack_ffffffffffffe704,in_stack_ffffffffffffe700),
                 (shared_ptr<soplex::Tolerances> *)
                 CONCAT44(in_stack_ffffffffffffe6fc,in_stack_ffffffffffffe6f8));
      FreeConstraintPS::FreeConstraintPS
                (in_stack_ffffffffffffe760,in_stack_ffffffffffffe758,in_stack_ffffffffffffe754,
                 in_stack_ffffffffffffe748);
      local_821 = 0;
      std::
      shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>::PostStep>
      ::
      shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>::FreeConstraintPS,void>
                ((shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>
                  *)CONCAT44(in_stack_ffffffffffffe704,in_stack_ffffffffffffe700),
                 (FreeConstraintPS *)CONCAT44(in_stack_ffffffffffffe6fc,in_stack_ffffffffffffe6f8));
      std::shared_ptr<soplex::Tolerances>::~shared_ptr((shared_ptr<soplex::Tolerances> *)0x3d6ee7);
      Array<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>
      ::append((Array<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>
                *)CONCAT44(in_stack_ffffffffffffe704,in_stack_ffffffffffffe700),
               (shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>
                *)CONCAT44(in_stack_ffffffffffffe6fc,in_stack_ffffffffffffe6f8));
      local_6e4 = local_6e4 + 1;
      pSVar12 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::rowVector((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                             *)CONCAT44(in_stack_ffffffffffffe704,in_stack_ffffffffffffe700),
                            in_stack_ffffffffffffe6fc);
      iVar6 = SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::size(pSVar12);
      local_6ec = local_6ec + iVar6;
      removeRow(in_stack_ffffffffffffe710,in_stack_ffffffffffffe708,in_stack_ffffffffffffe704);
      piVar13 = DataArray<int>::operator[](&in_RDI->m_stat,1);
      *piVar13 = *piVar13 + 1;
      std::
      shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>
      ::~shared_ptr((shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>
                     *)0x3d6f9d);
    }
  }
  local_92c = 0;
  while (iVar6 = local_92c,
        iVar7 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::nCols((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         *)0x3d745b), iVar6 < iVar7) {
    pSVar12 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::colVector((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           *)CONCAT44(in_stack_ffffffffffffe704,in_stack_ffffffffffffe700),
                          in_stack_ffffffffffffe6fc);
    iVar6 = SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ::size(pSVar12);
    if (iVar6 == 1) {
      pSVar12 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::colVector((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                             *)CONCAT44(in_stack_ffffffffffffe704,in_stack_ffffffffffffe700),
                            in_stack_ffffffffffffe6fc);
      pcVar14 = SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::index(pSVar12,(char *)0x0,__c);
      local_930 = SUB84(pcVar14,0);
      pSVar12 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::colVector((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                             *)CONCAT44(in_stack_ffffffffffffe704,in_stack_ffffffffffffe700),
                            in_stack_ffffffffffffe6fc);
      local_450 = SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ::value(pSVar12,0);
      local_448 = &local_968;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                ((cpp_dec_float<50U,_int,_void> *)
                 CONCAT44(in_stack_ffffffffffffe704,in_stack_ffffffffffffe700),
                 (cpp_dec_float<50U,_int,_void> *)
                 CONCAT44(in_stack_ffffffffffffe6fc,in_stack_ffffffffffffe6f8));
      local_190 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ::maxObj((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            *)CONCAT44(in_stack_ffffffffffffe704,in_stack_ffffffffffffe700),
                           in_stack_ffffffffffffe6fc);
      local_198 = &local_968;
      local_188 = local_9a0;
      boost::multiprecision::detail::
      scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
      ::
      scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                (&local_199,local_190,&local_968);
      local_180 = local_9a0;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                ((cpp_dec_float<50U,_int,_void> *)
                 CONCAT44(in_stack_ffffffffffffe704,in_stack_ffffffffffffe700));
      local_170 = local_190;
      local_178 = local_198;
      local_168 = local_9a0;
      boost::multiprecision::default_ops::
      eval_divide<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                ((cpp_dec_float<50U,_int,_void> *)
                 CONCAT44(in_stack_ffffffffffffe704,in_stack_ffffffffffffe700),
                 (cpp_dec_float<50U,_int,_void> *)
                 CONCAT44(in_stack_ffffffffffffe6fc,in_stack_ffffffffffffe6f8),
                 (cpp_dec_float<50U,_int,_void> *)0x3d7612);
      local_9a4 = 0;
      tVar4 = boost::multiprecision::operator>
                        ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)in_stack_ffffffffffffe708,
                         (int *)CONCAT44(in_stack_ffffffffffffe704,in_stack_ffffffffffffe700));
      if (tVar4) {
        SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::lower((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *)CONCAT44(in_stack_ffffffffffffe704,in_stack_ffffffffffffe700),
                in_stack_ffffffffffffe6fc);
        puVar11 = (ulong *)infinity();
        local_9e8 = *puVar11 ^ 0x8000000000000000;
        local_5f0 = local_9dc;
        local_5f8 = &local_9e8;
        local_600 = 0;
        local_1e8 = local_5f8;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                  ((cpp_dec_float<50U,_int,_void> *)in_stack_ffffffffffffe710,
                   (double)in_stack_ffffffffffffe708,
                   (type *)CONCAT44(in_stack_ffffffffffffe704,in_stack_ffffffffffffe700));
        tVar4 = boost::multiprecision::operator<=
                          ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)CONCAT44(in_stack_ffffffffffffe6fc,in_stack_ffffffffffffe6f8),
                           (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)0x3d76fc);
        local_15fa = false;
        if (tVar4) {
          VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        *)CONCAT44(in_stack_ffffffffffffe704,in_stack_ffffffffffffe700),
                       in_stack_ffffffffffffe6fc);
          local_15fa = boost::multiprecision::operator<
                                 ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                   *)CONCAT44(in_stack_ffffffffffffe6fc,in_stack_ffffffffffffe6f8),
                                  (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                   *)0x3d7740);
        }
        if (local_15fa != false) {
          local_278 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                    *)CONCAT44(in_stack_ffffffffffffe704,in_stack_ffffffffffffe700),
                                   in_stack_ffffffffffffe6fc);
          local_280 = local_9a0;
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                    ((cpp_dec_float<50U,_int,_void> *)
                     CONCAT44(in_stack_ffffffffffffe704,in_stack_ffffffffffffe700),
                     (cpp_dec_float<50U,_int,_void> *)
                     CONCAT44(in_stack_ffffffffffffe6fc,in_stack_ffffffffffffe6f8));
        }
        SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::upper((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *)CONCAT44(in_stack_ffffffffffffe704,in_stack_ffffffffffffe700),
                in_stack_ffffffffffffe6fc);
        local_5e0 = infinity();
        local_5d8 = local_a20;
        local_5e8 = 0;
        local_1f0 = local_5e0;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                  ((cpp_dec_float<50U,_int,_void> *)in_stack_ffffffffffffe710,
                   (double)in_stack_ffffffffffffe708,
                   (type *)CONCAT44(in_stack_ffffffffffffe704,in_stack_ffffffffffffe700));
        tVar4 = boost::multiprecision::operator>=
                          ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)CONCAT44(in_stack_ffffffffffffe6fc,in_stack_ffffffffffffe6f8),
                           (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)0x3d7834);
        local_160a = false;
        if (tVar4) {
          VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        *)CONCAT44(in_stack_ffffffffffffe704,in_stack_ffffffffffffe700),
                       in_stack_ffffffffffffe6fc);
          local_160a = boost::multiprecision::operator>
                                 ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                   *)CONCAT44(in_stack_ffffffffffffe6fc,in_stack_ffffffffffffe6f8),
                                  (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                   *)0x3d7878);
        }
        if (local_160a != false) {
          local_288 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                    *)CONCAT44(in_stack_ffffffffffffe704,in_stack_ffffffffffffe700),
                                   in_stack_ffffffffffffe6fc);
          local_290 = local_9a0;
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                    ((cpp_dec_float<50U,_int,_void> *)
                     CONCAT44(in_stack_ffffffffffffe704,in_stack_ffffffffffffe700),
                     (cpp_dec_float<50U,_int,_void> *)
                     CONCAT44(in_stack_ffffffffffffe6fc,in_stack_ffffffffffffe6f8));
        }
      }
      else {
        local_a24 = 0;
        tVar4 = boost::multiprecision::operator<
                          ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)in_stack_ffffffffffffe708,
                           (int *)CONCAT44(in_stack_ffffffffffffe704,in_stack_ffffffffffffe700));
        if (tVar4) {
          SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::lower((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *)CONCAT44(in_stack_ffffffffffffe704,in_stack_ffffffffffffe700),
                  in_stack_ffffffffffffe6fc);
          puVar11 = (ulong *)infinity();
          local_a68 = *puVar11 ^ 0x8000000000000000;
          local_5c0 = local_a5c;
          local_5c8 = &local_a68;
          local_5d0 = 0;
          local_1f8 = local_5c8;
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                    ((cpp_dec_float<50U,_int,_void> *)in_stack_ffffffffffffe710,
                     (double)in_stack_ffffffffffffe708,
                     (type *)CONCAT44(in_stack_ffffffffffffe704,in_stack_ffffffffffffe700));
          tVar4 = boost::multiprecision::operator<=
                            ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)CONCAT44(in_stack_ffffffffffffe6fc,in_stack_ffffffffffffe6f8),
                             (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)0x3d79ca);
          local_161a = false;
          if (tVar4) {
            VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          *)CONCAT44(in_stack_ffffffffffffe704,in_stack_ffffffffffffe700),
                         in_stack_ffffffffffffe6fc);
            local_161a = boost::multiprecision::operator>
                                   ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                     *)CONCAT44(in_stack_ffffffffffffe6fc,in_stack_ffffffffffffe6f8)
                                    ,(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                      *)0x3d7a0e);
          }
          if (local_161a != false) {
            local_298 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                      *)CONCAT44(in_stack_ffffffffffffe704,in_stack_ffffffffffffe700
                                                ),in_stack_ffffffffffffe6fc);
            local_2a0 = local_9a0;
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                      ((cpp_dec_float<50U,_int,_void> *)
                       CONCAT44(in_stack_ffffffffffffe704,in_stack_ffffffffffffe700),
                       (cpp_dec_float<50U,_int,_void> *)
                       CONCAT44(in_stack_ffffffffffffe6fc,in_stack_ffffffffffffe6f8));
          }
          SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::upper((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *)CONCAT44(in_stack_ffffffffffffe704,in_stack_ffffffffffffe700),
                  in_stack_ffffffffffffe6fc);
          local_5b0 = infinity();
          local_5a8 = local_aa0;
          local_5b8 = 0;
          local_200 = local_5b0;
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                    ((cpp_dec_float<50U,_int,_void> *)in_stack_ffffffffffffe710,
                     (double)in_stack_ffffffffffffe708,
                     (type *)CONCAT44(in_stack_ffffffffffffe704,in_stack_ffffffffffffe700));
          tVar4 = boost::multiprecision::operator>=
                            ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)CONCAT44(in_stack_ffffffffffffe6fc,in_stack_ffffffffffffe6f8),
                             (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)0x3d7b02);
          local_162a = false;
          if (tVar4) {
            VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          *)CONCAT44(in_stack_ffffffffffffe704,in_stack_ffffffffffffe700),
                         in_stack_ffffffffffffe6fc);
            local_162a = boost::multiprecision::operator<
                                   ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                     *)CONCAT44(in_stack_ffffffffffffe6fc,in_stack_ffffffffffffe6f8)
                                    ,(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                      *)0x3d7b46);
          }
          if (local_162a != false) {
            local_2a8 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                      *)CONCAT44(in_stack_ffffffffffffe704,in_stack_ffffffffffffe700
                                                ),in_stack_ffffffffffffe6fc);
            local_2b0 = local_9a0;
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                      ((cpp_dec_float<50U,_int,_void> *)
                       CONCAT44(in_stack_ffffffffffffe704,in_stack_ffffffffffffe700),
                       (cpp_dec_float<50U,_int,_void> *)
                       CONCAT44(in_stack_ffffffffffffe6fc,in_stack_ffffffffffffe6f8));
          }
        }
      }
    }
    local_92c = local_92c + 1;
  }
  for (local_aa4 = 0; iVar9 = local_aa4,
      iVar8 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::nCols((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       *)0x3d7bf1), iVar9 < iVar8; local_aa4 = local_aa4 + 1) {
    local_ab0 = 0;
    pnVar15 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            *)CONCAT44(in_stack_ffffffffffffe704,in_stack_ffffffffffffe700),
                           in_stack_ffffffffffffe6fc);
    local_60 = &local_ab0;
    local_58 = pnVar15;
    local_50 = local_60;
    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
              (in_stack_ffffffffffffe788,in_stack_ffffffffffffe780);
    local_2b8 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              *)CONCAT44(in_stack_ffffffffffffe704,in_stack_ffffffffffffe700),
                             in_stack_ffffffffffffe6fc);
    local_2c0 = pnVar15;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
              ((cpp_dec_float<50U,_int,_void> *)
               CONCAT44(in_stack_ffffffffffffe704,in_stack_ffffffffffffe700),
               (cpp_dec_float<50U,_int,_void> *)
               CONCAT44(in_stack_ffffffffffffe6fc,in_stack_ffffffffffffe6f8));
    local_ab8 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::colVector((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                             *)CONCAT44(in_stack_ffffffffffffe704,in_stack_ffffffffffffe700),
                            in_stack_ffffffffffffe6fc);
    for (local_abc = 0; uVar2 = local_abc,
        iVar9 = SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::size(local_ab8), (int)uVar2 < iVar9; local_abc = local_abc + 1) {
      VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    *)CONCAT44(in_stack_ffffffffffffe704,in_stack_ffffffffffffe700),
                   in_stack_ffffffffffffe6fc);
      puVar11 = (ulong *)infinity();
      local_b00 = *puVar11 ^ 0x8000000000000000;
      local_590 = local_af4;
      local_598 = &local_b00;
      local_5a0 = 0;
      local_208 = local_598;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                ((cpp_dec_float<50U,_int,_void> *)in_stack_ffffffffffffe710,
                 (double)in_stack_ffffffffffffe708,
                 (type *)CONCAT44(in_stack_ffffffffffffe704,in_stack_ffffffffffffe700));
      tVar4 = boost::multiprecision::operator<=
                        ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)CONCAT44(in_stack_ffffffffffffe6fc,in_stack_ffffffffffffe6f8),
                         (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)0x3d7dd1);
      local_165a = false;
      if (tVar4) {
        VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      *)CONCAT44(in_stack_ffffffffffffe704,in_stack_ffffffffffffe700),
                     in_stack_ffffffffffffe6fc);
        local_580 = infinity();
        local_578 = local_b38;
        local_588 = 0;
        local_210 = local_580;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                  ((cpp_dec_float<50U,_int,_void> *)in_stack_ffffffffffffe710,
                   (double)in_stack_ffffffffffffe708,
                   (type *)CONCAT44(in_stack_ffffffffffffe704,in_stack_ffffffffffffe700));
        local_165a = boost::multiprecision::operator>=
                               ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                 *)CONCAT44(in_stack_ffffffffffffe6fc,in_stack_ffffffffffffe6f8),
                                (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                 *)0x3d7e7f);
      }
      if (local_165a != false) break;
      local_440 = SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ::value(local_ab8,local_abc);
      local_438 = &local_b70;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                ((cpp_dec_float<50U,_int,_void> *)
                 CONCAT44(in_stack_ffffffffffffe704,in_stack_ffffffffffffe700),
                 (cpp_dec_float<50U,_int,_void> *)
                 CONCAT44(in_stack_ffffffffffffe6fc,in_stack_ffffffffffffe6f8));
      pcVar14 = SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::index(local_ab8,(char *)(ulong)local_abc,__c_00);
      local_b74 = SUB84(pcVar14,0);
      local_b78 = 0;
      tVar4 = boost::multiprecision::operator>
                        ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)in_stack_ffffffffffffe708,
                         (int *)CONCAT44(in_stack_ffffffffffffe704,in_stack_ffffffffffffe700));
      if (tVar4) {
        VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      *)CONCAT44(in_stack_ffffffffffffe704,in_stack_ffffffffffffe700),
                     in_stack_ffffffffffffe6fc);
        puVar11 = (ulong *)infinity();
        local_bb8 = *puVar11 ^ 0x8000000000000000;
        local_560 = local_bb0;
        local_568 = &local_bb8;
        local_570 = 0;
        local_218 = local_568;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                  ((cpp_dec_float<50U,_int,_void> *)in_stack_ffffffffffffe710,
                   (double)in_stack_ffffffffffffe708,
                   (type *)CONCAT44(in_stack_ffffffffffffe704,in_stack_ffffffffffffe700));
        tVar4 = boost::multiprecision::operator<=
                          ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)CONCAT44(in_stack_ffffffffffffe6fc,in_stack_ffffffffffffe6f8),
                           (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)0x3d7ff2);
        if (tVar4) {
          puVar11 = (ulong *)infinity();
          local_bf8 = *puVar11 ^ 0x8000000000000000;
          local_548 = local_bf0;
          local_550 = &local_bf8;
          local_558 = 0;
          local_220 = local_550;
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                    ((cpp_dec_float<50U,_int,_void> *)in_stack_ffffffffffffe710,
                     (double)in_stack_ffffffffffffe708,
                     (type *)CONCAT44(in_stack_ffffffffffffe704,in_stack_ffffffffffffe700));
          local_2e8 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                    *)CONCAT44(in_stack_ffffffffffffe704,in_stack_ffffffffffffe700),
                                   in_stack_ffffffffffffe6fc);
          local_2f0 = local_bf0;
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                    ((cpp_dec_float<50U,_int,_void> *)
                     CONCAT44(in_stack_ffffffffffffe704,in_stack_ffffffffffffe700),
                     (cpp_dec_float<50U,_int,_void> *)
                     CONCAT44(in_stack_ffffffffffffe6fc,in_stack_ffffffffffffe6f8));
        }
        else {
          local_98 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                   *)CONCAT44(in_stack_ffffffffffffe704,in_stack_ffffffffffffe700),
                                  in_stack_ffffffffffffe6fc);
          local_90 = &local_b70;
          local_88 = local_c30;
          boost::multiprecision::detail::
          scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
          ::
          scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                    (&local_99,local_90,local_98);
          local_80 = local_c30;
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                    ((cpp_dec_float<50U,_int,_void> *)
                     CONCAT44(in_stack_ffffffffffffe704,in_stack_ffffffffffffe700));
          local_70 = local_90;
          local_78 = local_98;
          local_68 = local_c30;
          boost::multiprecision::default_ops::
          eval_multiply<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                    ((cpp_dec_float<50U,_int,_void> *)
                     CONCAT44(in_stack_ffffffffffffe704,in_stack_ffffffffffffe700),
                     (cpp_dec_float<50U,_int,_void> *)
                     CONCAT44(in_stack_ffffffffffffe6fc,in_stack_ffffffffffffe6f8),
                     (cpp_dec_float<50U,_int,_void> *)0x3d8196);
          VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        *)CONCAT44(in_stack_ffffffffffffe704,in_stack_ffffffffffffe700),
                       in_stack_ffffffffffffe6fc);
          boost::multiprecision::
          number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          ::operator+=(in_stack_ffffffffffffe720,in_stack_ffffffffffffe718);
        }
        VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      *)CONCAT44(in_stack_ffffffffffffe704,in_stack_ffffffffffffe700),
                     in_stack_ffffffffffffe6fc);
        local_538 = infinity();
        local_530 = local_c68;
        local_540 = 0;
        local_228 = local_538;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                  ((cpp_dec_float<50U,_int,_void> *)in_stack_ffffffffffffe710,
                   (double)in_stack_ffffffffffffe708,
                   (type *)CONCAT44(in_stack_ffffffffffffe704,in_stack_ffffffffffffe700));
        tVar4 = boost::multiprecision::operator>=
                          ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)CONCAT44(in_stack_ffffffffffffe6fc,in_stack_ffffffffffffe6f8),
                           (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)0x3d824d);
        if (tVar4) {
          local_520 = infinity();
          local_518 = local_ca0;
          local_528 = 0;
          local_230 = local_520;
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                    ((cpp_dec_float<50U,_int,_void> *)in_stack_ffffffffffffe710,
                     (double)in_stack_ffffffffffffe708,
                     (type *)CONCAT44(in_stack_ffffffffffffe704,in_stack_ffffffffffffe700));
          local_2f8 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                    *)CONCAT44(in_stack_ffffffffffffe704,in_stack_ffffffffffffe700),
                                   in_stack_ffffffffffffe6fc);
          local_300 = local_ca0;
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                    ((cpp_dec_float<50U,_int,_void> *)
                     CONCAT44(in_stack_ffffffffffffe704,in_stack_ffffffffffffe700),
                     (cpp_dec_float<50U,_int,_void> *)
                     CONCAT44(in_stack_ffffffffffffe6fc,in_stack_ffffffffffffe6f8));
        }
        else {
          local_d8 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                   *)CONCAT44(in_stack_ffffffffffffe704,in_stack_ffffffffffffe700),
                                  in_stack_ffffffffffffe6fc);
          local_d0 = &local_b70;
          local_c8 = local_cd8;
          boost::multiprecision::detail::
          scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
          ::
          scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                    (&local_d9,local_d0,local_d8);
          local_c0 = local_cd8;
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                    ((cpp_dec_float<50U,_int,_void> *)
                     CONCAT44(in_stack_ffffffffffffe704,in_stack_ffffffffffffe700));
          local_b0 = local_d0;
          local_b8 = local_d8;
          local_a8 = local_cd8;
          boost::multiprecision::default_ops::
          eval_multiply<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                    ((cpp_dec_float<50U,_int,_void> *)
                     CONCAT44(in_stack_ffffffffffffe704,in_stack_ffffffffffffe700),
                     (cpp_dec_float<50U,_int,_void> *)
                     CONCAT44(in_stack_ffffffffffffe6fc,in_stack_ffffffffffffe6f8),
                     (cpp_dec_float<50U,_int,_void> *)0x3d83d1);
          VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        *)CONCAT44(in_stack_ffffffffffffe704,in_stack_ffffffffffffe700),
                       in_stack_ffffffffffffe6fc);
          boost::multiprecision::
          number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          ::operator+=(in_stack_ffffffffffffe720,in_stack_ffffffffffffe718);
        }
      }
      else {
        local_cdc = 0;
        tVar4 = boost::multiprecision::operator<
                          ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)in_stack_ffffffffffffe708,
                           (int *)CONCAT44(in_stack_ffffffffffffe704,in_stack_ffffffffffffe700));
        if (tVar4) {
          VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        *)CONCAT44(in_stack_ffffffffffffe704,in_stack_ffffffffffffe700),
                       in_stack_ffffffffffffe6fc);
          puVar11 = (ulong *)infinity();
          local_d20 = *puVar11 ^ 0x8000000000000000;
          local_500 = local_d14;
          local_508 = &local_d20;
          local_510 = 0;
          local_238 = local_508;
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                    ((cpp_dec_float<50U,_int,_void> *)in_stack_ffffffffffffe710,
                     (double)in_stack_ffffffffffffe708,
                     (type *)CONCAT44(in_stack_ffffffffffffe704,in_stack_ffffffffffffe700));
          tVar4 = boost::multiprecision::operator<=
                            ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)CONCAT44(in_stack_ffffffffffffe6fc,in_stack_ffffffffffffe6f8),
                             (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)0x3d84e6);
          if (tVar4) {
            local_4f0 = infinity();
            local_4e8 = local_d58;
            local_4f8 = 0;
            local_240 = local_4f0;
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                      ((cpp_dec_float<50U,_int,_void> *)in_stack_ffffffffffffe710,
                       (double)in_stack_ffffffffffffe708,
                       (type *)CONCAT44(in_stack_ffffffffffffe704,in_stack_ffffffffffffe700));
            local_308 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                      *)CONCAT44(in_stack_ffffffffffffe704,in_stack_ffffffffffffe700
                                                ),in_stack_ffffffffffffe6fc);
            local_310 = local_d58;
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                      ((cpp_dec_float<50U,_int,_void> *)
                       CONCAT44(in_stack_ffffffffffffe704,in_stack_ffffffffffffe700),
                       (cpp_dec_float<50U,_int,_void> *)
                       CONCAT44(in_stack_ffffffffffffe6fc,in_stack_ffffffffffffe6f8));
          }
          else {
            local_118 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                      *)CONCAT44(in_stack_ffffffffffffe704,in_stack_ffffffffffffe700
                                                ),in_stack_ffffffffffffe6fc);
            local_110 = &local_b70;
            local_108 = local_d90;
            boost::multiprecision::detail::
            scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
            ::
            scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                      (&local_119,local_110,local_118);
            local_100 = local_d90;
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                      ((cpp_dec_float<50U,_int,_void> *)
                       CONCAT44(in_stack_ffffffffffffe704,in_stack_ffffffffffffe700));
            local_f0 = local_110;
            local_f8 = local_118;
            local_e8 = local_d90;
            boost::multiprecision::default_ops::
            eval_multiply<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                      ((cpp_dec_float<50U,_int,_void> *)
                       CONCAT44(in_stack_ffffffffffffe704,in_stack_ffffffffffffe700),
                       (cpp_dec_float<50U,_int,_void> *)
                       CONCAT44(in_stack_ffffffffffffe6fc,in_stack_ffffffffffffe6f8),
                       (cpp_dec_float<50U,_int,_void> *)0x3d866a);
            VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          *)CONCAT44(in_stack_ffffffffffffe704,in_stack_ffffffffffffe700),
                         in_stack_ffffffffffffe6fc);
            boost::multiprecision::
            number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
            ::operator+=(in_stack_ffffffffffffe720,in_stack_ffffffffffffe718);
          }
          VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        *)CONCAT44(in_stack_ffffffffffffe704,in_stack_ffffffffffffe700),
                       in_stack_ffffffffffffe6fc);
          local_4d8 = infinity();
          local_4d0 = local_dc8;
          local_4e0 = 0;
          local_248 = local_4d8;
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                    ((cpp_dec_float<50U,_int,_void> *)in_stack_ffffffffffffe710,
                     (double)in_stack_ffffffffffffe708,
                     (type *)CONCAT44(in_stack_ffffffffffffe704,in_stack_ffffffffffffe700));
          tVar4 = boost::multiprecision::operator>=
                            ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)CONCAT44(in_stack_ffffffffffffe6fc,in_stack_ffffffffffffe6f8),
                             (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)0x3d8721);
          if (tVar4) {
            puVar11 = (ulong *)infinity();
            local_e08 = *puVar11 ^ 0x8000000000000000;
            local_4b8 = local_e00;
            local_4c0 = &local_e08;
            local_4c8 = 0;
            local_250 = local_4c0;
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                      ((cpp_dec_float<50U,_int,_void> *)in_stack_ffffffffffffe710,
                       (double)in_stack_ffffffffffffe708,
                       (type *)CONCAT44(in_stack_ffffffffffffe704,in_stack_ffffffffffffe700));
            local_318 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                      *)CONCAT44(in_stack_ffffffffffffe704,in_stack_ffffffffffffe700
                                                ),in_stack_ffffffffffffe6fc);
            local_320 = local_e00;
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                      ((cpp_dec_float<50U,_int,_void> *)
                       CONCAT44(in_stack_ffffffffffffe704,in_stack_ffffffffffffe700),
                       (cpp_dec_float<50U,_int,_void> *)
                       CONCAT44(in_stack_ffffffffffffe6fc,in_stack_ffffffffffffe6f8));
          }
          else {
            local_158 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                      *)CONCAT44(in_stack_ffffffffffffe704,in_stack_ffffffffffffe700
                                                ),in_stack_ffffffffffffe6fc);
            local_150 = &local_b70;
            local_148 = local_e40;
            boost::multiprecision::detail::
            scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
            ::
            scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                      (&local_159,local_150,local_158);
            local_140 = local_e40;
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                      ((cpp_dec_float<50U,_int,_void> *)
                       CONCAT44(in_stack_ffffffffffffe704,in_stack_ffffffffffffe700));
            local_130 = local_150;
            local_138 = local_158;
            local_128 = local_e40;
            boost::multiprecision::default_ops::
            eval_multiply<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                      ((cpp_dec_float<50U,_int,_void> *)
                       CONCAT44(in_stack_ffffffffffffe704,in_stack_ffffffffffffe700),
                       (cpp_dec_float<50U,_int,_void> *)
                       CONCAT44(in_stack_ffffffffffffe6fc,in_stack_ffffffffffffe6f8),
                       (cpp_dec_float<50U,_int,_void> *)0x3d88c5);
            VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          *)CONCAT44(in_stack_ffffffffffffe704,in_stack_ffffffffffffe700),
                         in_stack_ffffffffffffe6fc);
            boost::multiprecision::
            number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
            ::operator+=(in_stack_ffffffffffffe720,in_stack_ffffffffffffe718);
          }
        }
      }
    }
  }
  local_e44 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::nCols((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       *)0x3d8932);
  do {
    do {
      local_e44 = local_e44 + -1;
      if (local_e44 < 0) {
        if (0 < local_6e8 + local_6e4) {
          (in_RDI->
          super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).m_remRows = local_6e4 +
                        (in_RDI->
                        super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ).m_remRows;
          (in_RDI->
          super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).m_remCols = local_6e8 +
                        (in_RDI->
                        super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ).m_remCols;
          (in_RDI->
          super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).m_remNzos = local_6ec +
                        (in_RDI->
                        super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ).m_remNzos;
          if (((in_RDI->
               super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).spxout != (SPxOut *)0x0) &&
             (VVar10 = SPxOut::getVerbosity
                                 ((in_RDI->
                                  super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                  ).spxout), 3 < (int)VVar10)) {
            local_14f0[0] =
                 SPxOut::getVerbosity
                           ((in_RDI->
                            super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            ).spxout);
            pSVar1 = (in_RDI->
                     super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).spxout;
            local_14f4 = 4;
            (*pSVar1->_vptr_SPxOut[2])(pSVar1,&local_14f4);
            soplex::operator<<((SPxOut *)
                               CONCAT44(in_stack_ffffffffffffe704,in_stack_ffffffffffffe700),
                               (char *)CONCAT44(in_stack_ffffffffffffe6fc,in_stack_ffffffffffffe6f8)
                              );
            soplex::operator<<((SPxOut *)
                               CONCAT44(in_stack_ffffffffffffe704,in_stack_ffffffffffffe700),
                               in_stack_ffffffffffffe6fc);
            soplex::operator<<((SPxOut *)
                               CONCAT44(in_stack_ffffffffffffe704,in_stack_ffffffffffffe700),
                               (char *)CONCAT44(in_stack_ffffffffffffe6fc,in_stack_ffffffffffffe6f8)
                              );
            soplex::operator<<((SPxOut *)
                               CONCAT44(in_stack_ffffffffffffe704,in_stack_ffffffffffffe700),
                               in_stack_ffffffffffffe6fc);
            soplex::operator<<((SPxOut *)
                               CONCAT44(in_stack_ffffffffffffe704,in_stack_ffffffffffffe700),
                               (char *)CONCAT44(in_stack_ffffffffffffe6fc,in_stack_ffffffffffffe6f8)
                              );
            soplex::operator<<((SPxOut *)
                               CONCAT44(in_stack_ffffffffffffe704,in_stack_ffffffffffffe700),
                               in_stack_ffffffffffffe6fc);
            soplex::operator<<((SPxOut *)
                               CONCAT44(in_stack_ffffffffffffe704,in_stack_ffffffffffffe700),
                               (char *)CONCAT44(in_stack_ffffffffffffe6fc,in_stack_ffffffffffffe6f8)
                              );
            soplex::operator<<((SPxOut *)
                               CONCAT44(in_stack_ffffffffffffe704,in_stack_ffffffffffffe700),
                               (_func_ostream_ptr_ostream_ptr *)
                               CONCAT44(in_stack_ffffffffffffe6fc,in_stack_ffffffffffffe6f8));
            pSVar1 = (in_RDI->
                     super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).spxout;
            (*pSVar1->_vptr_SPxOut[2])(pSVar1,local_14f0);
          }
          local_14f8 = local_6e8 + local_6e4;
          local_30 = &(in_RDI->
                      super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).m_minReduction;
          local_1534 = local_6f4 + local_6f0;
          piVar13 = local_1530;
          local_38 = &local_1534;
          local_28 = piVar13;
          boost::multiprecision::detail::
          scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
          ::
          scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                    (&local_39,local_30);
          local_20 = piVar13;
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                    ((cpp_dec_float<50U,_int,_void> *)
                     CONCAT44(in_stack_ffffffffffffe704,in_stack_ffffffffffffe700));
          local_10 = local_30;
          local_18 = local_38;
          local_48 = (long)*local_38;
          local_8 = piVar13;
          boost::multiprecision::default_ops::
          eval_multiply<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,long_long>
                    ((cpp_dec_float<50U,_int,_void> *)
                     CONCAT44(in_stack_ffffffffffffe704,in_stack_ffffffffffffe700),
                     (cpp_dec_float<50U,_int,_void> *)
                     CONCAT44(in_stack_ffffffffffffe6fc,in_stack_ffffffffffffe6f8),
                     (longlong *)0x3da170);
          tVar4 = boost::multiprecision::operator>
                            (piVar13,(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                      *)CONCAT44(in_stack_ffffffffffffe704,in_stack_ffffffffffffe700
                                                ));
          in_stack_ffffffffffffe704 = CONCAT13(tVar4,(int3)in_stack_ffffffffffffe704);
          if (tVar4) {
            *local_6e0 = 1;
          }
        }
        local_6c4 = OKAY;
LAB_003da1bc:
        local_ef0 = 1;
        VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::~VectorBase((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       *)0x3da1c9);
        VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::~VectorBase((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       *)0x3da1d6);
        VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::~VectorBase((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       *)0x3da1e3);
        VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::~VectorBase((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       *)0x3da1f0);
        DataArray<bool>::~DataArray
                  ((DataArray<bool> *)CONCAT44(in_stack_ffffffffffffe704,in_stack_ffffffffffffe700))
        ;
        return local_6c4;
      }
      pSVar12 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::colVector((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                             *)CONCAT44(in_stack_ffffffffffffe704,in_stack_ffffffffffffe700),
                            in_stack_ffffffffffffe6fc);
      iVar9 = SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::size(pSVar12);
    } while (iVar9 < 2);
    local_430 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              *)CONCAT44(in_stack_ffffffffffffe704,in_stack_ffffffffffffe700),
                             in_stack_ffffffffffffe6fc);
    local_428 = local_e7c;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
              ((cpp_dec_float<50U,_int,_void> *)
               CONCAT44(in_stack_ffffffffffffe704,in_stack_ffffffffffffe700),
               (cpp_dec_float<50U,_int,_void> *)
               CONCAT44(in_stack_ffffffffffffe6fc,in_stack_ffffffffffffe6f8));
    local_420 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              *)CONCAT44(in_stack_ffffffffffffe704,in_stack_ffffffffffffe700),
                             in_stack_ffffffffffffe6fc);
    local_418 = local_eb4;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
              ((cpp_dec_float<50U,_int,_void> *)
               CONCAT44(in_stack_ffffffffffffe704,in_stack_ffffffffffffe700),
               (cpp_dec_float<50U,_int,_void> *)
               CONCAT44(in_stack_ffffffffffffe6fc,in_stack_ffffffffffffe6f8));
    opttol(in_stack_ffffffffffffe738);
    bVar5 = LTrel<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                      ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)CONCAT44(in_stack_ffffffffffffe7f4,in_stack_ffffffffffffe7f0),
                       in_stack_ffffffffffffe7e8,in_stack_ffffffffffffe7e0);
    if (bVar5) {
      pnVar15 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              *)CONCAT44(in_stack_ffffffffffffe704,in_stack_ffffffffffffe700),
                             in_stack_ffffffffffffe6fc);
      pnVar16 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              *)CONCAT44(in_stack_ffffffffffffe704,in_stack_ffffffffffffe700),
                             in_stack_ffffffffffffe6fc);
      SPxOut::
      debug<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_const_char_(&)[73],_int_&,_boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_&,_boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_&,_0>
                (in_RDI,(char (*) [73])
                        "IMAISM46 col {}: dual infeasible -> dual lhs bound={} dual rhs bound={}\n",
                 &local_e44,pnVar15,pnVar16);
      local_6c4 = DUAL_INFEASIBLE;
      goto LAB_003da1bc;
    }
    local_410 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::maxObj((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          *)CONCAT44(in_stack_ffffffffffffe704,in_stack_ffffffffffffe700),
                         in_stack_ffffffffffffe6fc);
    local_408 = &local_f28;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
              ((cpp_dec_float<50U,_int,_void> *)
               CONCAT44(in_stack_ffffffffffffe704,in_stack_ffffffffffffe700),
               (cpp_dec_float<50U,_int,_void> *)
               CONCAT44(in_stack_ffffffffffffe6fc,in_stack_ffffffffffffe6f8));
    local_3f8 = local_f60;
    local_400 = &local_f28;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
              ((cpp_dec_float<50U,_int,_void> *)
               CONCAT44(in_stack_ffffffffffffe704,in_stack_ffffffffffffe700),
               (cpp_dec_float<50U,_int,_void> *)
               CONCAT44(in_stack_ffffffffffffe6fc,in_stack_ffffffffffffe6f8));
    local_3f0 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              *)CONCAT44(in_stack_ffffffffffffe704,in_stack_ffffffffffffe700),
                             in_stack_ffffffffffffe6fc);
    local_3e8 = local_f98;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
              ((cpp_dec_float<50U,_int,_void> *)
               CONCAT44(in_stack_ffffffffffffe704,in_stack_ffffffffffffe700),
               (cpp_dec_float<50U,_int,_void> *)
               CONCAT44(in_stack_ffffffffffffe6fc,in_stack_ffffffffffffe6f8));
    opttol(in_stack_ffffffffffffe738);
    bVar5 = GTrel<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                      (in_stack_ffffffffffffe7c0,in_stack_ffffffffffffe7b8,
                       (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)CONCAT17(in_stack_ffffffffffffe7b7,
                                   CONCAT16(in_stack_ffffffffffffe7b6,
                                            CONCAT15(in_stack_ffffffffffffe7b5,
                                                     in_stack_ffffffffffffe7b0))));
    if (bVar5) {
      pnVar15 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              *)CONCAT44(in_stack_ffffffffffffe704,in_stack_ffffffffffffe700),
                             in_stack_ffffffffffffe6fc);
      SPxOut::
      debug<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_const_char_(&)[58],_int_&,_boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_&,_boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_&,_0>
                (in_RDI,(char (*) [58])"IMAISM47 col{}: dominated -> maxObj={} dual rhs bound={}\n",
                 &local_e44,&local_f28,pnVar15);
      SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::upper((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *)CONCAT44(in_stack_ffffffffffffe704,in_stack_ffffffffffffe700),
              in_stack_ffffffffffffe6fc);
      local_4a8 = infinity();
      local_4a0 = local_1008;
      local_4b0 = 0;
      local_258 = local_4a8;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                ((cpp_dec_float<50U,_int,_void> *)in_stack_ffffffffffffe710,
                 (double)in_stack_ffffffffffffe708,
                 (type *)CONCAT44(in_stack_ffffffffffffe704,in_stack_ffffffffffffe700));
      tVar4 = boost::multiprecision::operator>=
                        ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)CONCAT44(in_stack_ffffffffffffe6fc,in_stack_ffffffffffffe6f8),
                         (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)0x3d8ca5);
      if (tVar4) {
        if (((in_RDI->
             super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).spxout != (SPxOut *)0x0) &&
           (VVar10 = SPxOut::getVerbosity
                               ((in_RDI->
                                super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                ).spxout), 3 < (int)VVar10)) {
          local_100c = SPxOut::getVerbosity
                                 ((in_RDI->
                                  super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                  ).spxout);
          pSVar1 = (in_RDI->
                   super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).spxout;
          local_1010 = 4;
          (*pSVar1->_vptr_SPxOut[2])(pSVar1,&local_1010);
          soplex::operator<<((SPxOut *)CONCAT44(in_stack_ffffffffffffe704,in_stack_ffffffffffffe700)
                             ,(char *)CONCAT44(in_stack_ffffffffffffe6fc,in_stack_ffffffffffffe6f8))
          ;
          soplex::operator<<((SPxOut *)CONCAT44(in_stack_ffffffffffffe704,in_stack_ffffffffffffe700)
                             ,(_func_ostream_ptr_ostream_ptr *)
                              CONCAT44(in_stack_ffffffffffffe6fc,in_stack_ffffffffffffe6f8));
          pSVar1 = (in_RDI->
                   super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).spxout;
          (*pSVar1->_vptr_SPxOut[2])(pSVar1,&local_100c);
        }
        local_6c4 = UNBOUNDED;
        goto LAB_003da1bc;
      }
      pnVar15 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::upper((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         *)CONCAT44(in_stack_ffffffffffffe704,in_stack_ffffffffffffe700),
                        in_stack_ffffffffffffe6fc);
      SPxOut::
      debug<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_const_char_(&)[20],_const_boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_&,_0>
                (in_RDI,(char (*) [20])" fixed at upper={}\n",pnVar15);
      operator_new(0x30);
      local_1069 = 1;
      local_3e0 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ::upper((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           *)CONCAT44(in_stack_ffffffffffffe704,in_stack_ffffffffffffe700),
                          in_stack_ffffffffffffe6fc);
      local_3d8 = local_1058;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                ((cpp_dec_float<50U,_int,_void> *)
                 CONCAT44(in_stack_ffffffffffffe704,in_stack_ffffffffffffe700),
                 (cpp_dec_float<50U,_int,_void> *)
                 CONCAT44(in_stack_ffffffffffffe6fc,in_stack_ffffffffffffe6f8));
      std::shared_ptr<soplex::Tolerances>::shared_ptr
                ((shared_ptr<soplex::Tolerances> *)
                 CONCAT44(in_stack_ffffffffffffe704,in_stack_ffffffffffffe700),
                 (shared_ptr<soplex::Tolerances> *)
                 CONCAT44(in_stack_ffffffffffffe6fc,in_stack_ffffffffffffe6f8));
      FixBoundsPS::FixBoundsPS
                (in_stack_ffffffffffffea60,
                 (SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  *)CONCAT17(in_stack_ffffffffffffea5f,in_stack_ffffffffffffea58),
                 (int)((ulong)in_stack_ffffffffffffea50 >> 0x20),
                 (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *)CONCAT44(in_stack_ffffffffffffea4c,iVar7),
                 (shared_ptr<soplex::Tolerances> *)CONCAT44(iVar6,in_stack_ffffffffffffea40));
      local_1069 = 0;
      std::
      shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>::PostStep>
      ::
      shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>::FixBoundsPS,void>
                ((shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>
                  *)CONCAT44(in_stack_ffffffffffffe704,in_stack_ffffffffffffe700),
                 (FixBoundsPS *)CONCAT44(in_stack_ffffffffffffe6fc,in_stack_ffffffffffffe6f8));
      std::shared_ptr<soplex::Tolerances>::~shared_ptr((shared_ptr<soplex::Tolerances> *)0x3d8efb);
      Array<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>
      ::append((Array<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>
                *)CONCAT44(in_stack_ffffffffffffe704,in_stack_ffffffffffffe700),
               (shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>
                *)CONCAT44(in_stack_ffffffffffffe6fc,in_stack_ffffffffffffe6f8));
      pnVar15 = local_6d8;
      iVar9 = local_e44;
      pnVar16 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::upper((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         *)CONCAT44(in_stack_ffffffffffffe704,in_stack_ffffffffffffe700),
                        in_stack_ffffffffffffe6fc);
      (**(code **)(*(long *)(pnVar15->m_backend).data._M_elems + 0x150))(pnVar15,iVar9,pnVar16,0);
      piVar13 = DataArray<int>::operator[](&in_RDI->m_stat,10);
      *piVar13 = *piVar13 + 1;
      std::
      shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>
      ::~shared_ptr((shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>
                     *)0x3d8f9a);
    }
    else {
      local_3c8 = local_10a4;
      local_3d0 = &local_f28;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                ((cpp_dec_float<50U,_int,_void> *)
                 CONCAT44(in_stack_ffffffffffffe704,in_stack_ffffffffffffe700),
                 (cpp_dec_float<50U,_int,_void> *)
                 CONCAT44(in_stack_ffffffffffffe6fc,in_stack_ffffffffffffe6f8));
      local_3c0 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                *)CONCAT44(in_stack_ffffffffffffe704,in_stack_ffffffffffffe700),
                               in_stack_ffffffffffffe6fc);
      local_3b8 = local_10dc;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                ((cpp_dec_float<50U,_int,_void> *)
                 CONCAT44(in_stack_ffffffffffffe704,in_stack_ffffffffffffe700),
                 (cpp_dec_float<50U,_int,_void> *)
                 CONCAT44(in_stack_ffffffffffffe6fc,in_stack_ffffffffffffe6f8));
      opttol(in_stack_ffffffffffffe738);
      bVar5 = LTrel<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                        ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)CONCAT44(in_stack_ffffffffffffe7f4,in_stack_ffffffffffffe7f0),
                         in_stack_ffffffffffffe7e8,in_stack_ffffffffffffe7e0);
      if (bVar5) {
        pnVar15 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                *)CONCAT44(in_stack_ffffffffffffe704,in_stack_ffffffffffffe700),
                               in_stack_ffffffffffffe6fc);
        SPxOut::
        debug<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_const_char_(&)[59],_int_&,_boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_&,_boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_&,_0>
                  (in_RDI,(char (*) [59])
                          "IMAISM48 col {}: dominated -> maxObj={} dual lhs bound={}\n",&local_e44,
                   &local_f28,pnVar15);
        SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::lower((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *)CONCAT44(in_stack_ffffffffffffe704,in_stack_ffffffffffffe700),
                in_stack_ffffffffffffe6fc);
        puVar11 = (ulong *)infinity();
        in_stack_ffffffffffffeea8 =
             (SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              *)(*puVar11 ^ 0x8000000000000000);
        local_488 = &stack0xffffffffffffeeb4;
        local_490 = &stack0xffffffffffffeea8;
        local_498 = 0;
        local_260 = local_490;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                  ((cpp_dec_float<50U,_int,_void> *)in_stack_ffffffffffffe710,
                   (double)in_stack_ffffffffffffe708,
                   (type *)CONCAT44(in_stack_ffffffffffffe704,in_stack_ffffffffffffe700));
        tVar4 = boost::multiprecision::operator<=
                          ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)CONCAT44(in_stack_ffffffffffffe6fc,in_stack_ffffffffffffe6f8),
                           (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)0x3d91cc);
        if (tVar4) {
          if (((in_RDI->
               super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).spxout != (SPxOut *)0x0) &&
             (VVar10 = SPxOut::getVerbosity
                                 ((in_RDI->
                                  super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                  ).spxout), 3 < (int)VVar10)) {
            SPxOut::getVerbosity
                      ((in_RDI->
                       super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ).spxout);
            pSVar1 = (in_RDI->
                     super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).spxout;
            _local_1160 = 4;
            (*pSVar1->_vptr_SPxOut[2])(pSVar1,local_1160);
            soplex::operator<<((SPxOut *)
                               CONCAT44(in_stack_ffffffffffffe704,in_stack_ffffffffffffe700),
                               (char *)CONCAT44(in_stack_ffffffffffffe6fc,in_stack_ffffffffffffe6f8)
                              );
            soplex::operator<<((SPxOut *)
                               CONCAT44(in_stack_ffffffffffffe704,in_stack_ffffffffffffe700),
                               (_func_ostream_ptr_ostream_ptr *)
                               CONCAT44(in_stack_ffffffffffffe6fc,in_stack_ffffffffffffe6f8));
            pSVar1 = (in_RDI->
                     super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).spxout;
            (*pSVar1->_vptr_SPxOut[2])(pSVar1,&stack0xffffffffffffeea4);
          }
          local_6c4 = UNBOUNDED;
          goto LAB_003da1bc;
        }
        pnVar15 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ::lower((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           *)CONCAT44(in_stack_ffffffffffffe704,in_stack_ffffffffffffe700),
                          in_stack_ffffffffffffe6fc);
        SPxOut::
        debug<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_const_char_(&)[20],_const_boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_&,_0>
                  (in_RDI,(char (*) [20])" fixed at lower={}\n",pnVar15);
        operator_new(0x30);
        local_11b9 = 1;
        local_3b0 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ::lower((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                             *)CONCAT44(in_stack_ffffffffffffe704,in_stack_ffffffffffffe700),
                            in_stack_ffffffffffffe6fc);
        local_3a8 = local_11a8;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                  ((cpp_dec_float<50U,_int,_void> *)
                   CONCAT44(in_stack_ffffffffffffe704,in_stack_ffffffffffffe700),
                   (cpp_dec_float<50U,_int,_void> *)
                   CONCAT44(in_stack_ffffffffffffe6fc,in_stack_ffffffffffffe6f8));
        std::shared_ptr<soplex::Tolerances>::shared_ptr
                  ((shared_ptr<soplex::Tolerances> *)
                   CONCAT44(in_stack_ffffffffffffe704,in_stack_ffffffffffffe700),
                   (shared_ptr<soplex::Tolerances> *)
                   CONCAT44(in_stack_ffffffffffffe6fc,in_stack_ffffffffffffe6f8));
        FixBoundsPS::FixBoundsPS
                  (in_stack_ffffffffffffea60,
                   (SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    *)CONCAT17(in_stack_ffffffffffffea5f,in_stack_ffffffffffffea58),
                   (int)((ulong)in_stack_ffffffffffffea50 >> 0x20),
                   (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)CONCAT44(in_stack_ffffffffffffea4c,iVar7),
                   (shared_ptr<soplex::Tolerances> *)CONCAT44(iVar6,in_stack_ffffffffffffea40));
        local_11b9 = 0;
        std::
        shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>::PostStep>
        ::
        shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>::FixBoundsPS,void>
                  ((shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>
                    *)CONCAT44(in_stack_ffffffffffffe704,in_stack_ffffffffffffe700),
                   (FixBoundsPS *)CONCAT44(in_stack_ffffffffffffe6fc,in_stack_ffffffffffffe6f8));
        std::shared_ptr<soplex::Tolerances>::~shared_ptr((shared_ptr<soplex::Tolerances> *)0x3d9422)
        ;
        Array<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>
        ::append((Array<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>
                  *)CONCAT44(in_stack_ffffffffffffe704,in_stack_ffffffffffffe700),
                 (shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>
                  *)CONCAT44(in_stack_ffffffffffffe6fc,in_stack_ffffffffffffe6f8));
        pnVar15 = local_6d8;
        iVar9 = local_e44;
        pnVar16 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ::lower((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           *)CONCAT44(in_stack_ffffffffffffe704,in_stack_ffffffffffffe700),
                          in_stack_ffffffffffffe6fc);
        (**(code **)(*(long *)(pnVar15->m_backend).data._M_elems + 0x168))(pnVar15,iVar9,pnVar16,0);
        piVar13 = DataArray<int>::operator[](&in_RDI->m_stat,10);
        *piVar13 = *piVar13 + 1;
        std::
        shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>
        ::~shared_ptr((shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>
                       *)0x3d94c1);
      }
      else {
        SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::upper((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *)CONCAT44(in_stack_ffffffffffffe704,in_stack_ffffffffffffe700),
                in_stack_ffffffffffffe6fc);
        local_478 = infinity();
        local_470 = local_11f4;
        local_480 = 0;
        local_268 = local_478;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                  ((cpp_dec_float<50U,_int,_void> *)in_stack_ffffffffffffe710,
                   (double)in_stack_ffffffffffffe708,
                   (type *)CONCAT44(in_stack_ffffffffffffe704,in_stack_ffffffffffffe700));
        tVar4 = boost::multiprecision::operator<
                          ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)CONCAT44(in_stack_ffffffffffffe6fc,in_stack_ffffffffffffe6f8),
                           (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)0x3d95d3);
        local_17f2 = false;
        if (tVar4) {
          local_398 = local_122c;
          local_3a0 = &local_f28;
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                    ((cpp_dec_float<50U,_int,_void> *)
                     CONCAT44(in_stack_ffffffffffffe704,in_stack_ffffffffffffe700),
                     (cpp_dec_float<50U,_int,_void> *)
                     CONCAT44(in_stack_ffffffffffffe6fc,in_stack_ffffffffffffe6f8));
          local_390 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                    *)CONCAT44(in_stack_ffffffffffffe704,in_stack_ffffffffffffe700),
                                   in_stack_ffffffffffffe6fc);
          local_388 = local_1264;
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                    ((cpp_dec_float<50U,_int,_void> *)
                     CONCAT44(in_stack_ffffffffffffe704,in_stack_ffffffffffffe700),
                     (cpp_dec_float<50U,_int,_void> *)
                     CONCAT44(in_stack_ffffffffffffe6fc,in_stack_ffffffffffffe6f8));
          opttol(in_stack_ffffffffffffe738);
          local_17f2 = EQrel<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                                 ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                   *)CONCAT44(in_stack_ffffffffffffe7f4,in_stack_ffffffffffffe7f0),
                                  in_stack_ffffffffffffe7e8,in_stack_ffffffffffffe7e0);
        }
        if (local_17f2 == false) {
          in_stack_ffffffffffffe7b8 =
               SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ::lower((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        *)CONCAT44(in_stack_ffffffffffffe704,in_stack_ffffffffffffe700),
                       in_stack_ffffffffffffe6fc);
          puVar11 = (ulong *)infinity();
          local_1340 = *puVar11 ^ 0x8000000000000000;
          local_458 = local_1334;
          local_460 = &local_1340;
          local_468 = 0;
          local_270 = local_460;
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                    ((cpp_dec_float<50U,_int,_void> *)in_stack_ffffffffffffe710,
                     (double)in_stack_ffffffffffffe708,
                     (type *)CONCAT44(in_stack_ffffffffffffe704,in_stack_ffffffffffffe700));
          in_stack_ffffffffffffe7b7 =
               boost::multiprecision::operator>
                         ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)CONCAT44(in_stack_ffffffffffffe6fc,in_stack_ffffffffffffe6f8),
                          (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)0x3d99db);
          in_stack_ffffffffffffe7b6 = false;
          if ((bool)in_stack_ffffffffffffe7b7) {
            local_368 = local_1378;
            local_370 = &local_f28;
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                      ((cpp_dec_float<50U,_int,_void> *)
                       CONCAT44(in_stack_ffffffffffffe704,in_stack_ffffffffffffe700),
                       (cpp_dec_float<50U,_int,_void> *)
                       CONCAT44(in_stack_ffffffffffffe6fc,in_stack_ffffffffffffe6f8));
            local_360 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                      *)CONCAT44(in_stack_ffffffffffffe704,in_stack_ffffffffffffe700
                                                ),in_stack_ffffffffffffe6fc);
            local_358 = local_13b0;
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                      ((cpp_dec_float<50U,_int,_void> *)
                       CONCAT44(in_stack_ffffffffffffe704,in_stack_ffffffffffffe700),
                       (cpp_dec_float<50U,_int,_void> *)
                       CONCAT44(in_stack_ffffffffffffe6fc,in_stack_ffffffffffffe6f8));
            opttol(in_stack_ffffffffffffe738);
            in_stack_ffffffffffffe7b5 =
                 EQrel<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                           ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                             *)CONCAT44(in_stack_ffffffffffffe7f4,in_stack_ffffffffffffe7f0),
                            in_stack_ffffffffffffe7e8,in_stack_ffffffffffffe7e0);
            in_stack_ffffffffffffe7b6 = in_stack_ffffffffffffe7b5;
          }
          if ((bool)in_stack_ffffffffffffe7b6 != false) {
            pnVar15 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                    *)CONCAT44(in_stack_ffffffffffffe704,in_stack_ffffffffffffe700),
                                   in_stack_ffffffffffffe6fc);
            SPxOut::
            debug<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_const_char_(&)[66],_int_&,_boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_&,_boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_&,_0>
                      (in_RDI,(char (*) [66])
                              "IMAISM50 col {}: weakly dominated -> maxObj={} dual lhs bound={}\n",
                       &local_e44,&local_f28,pnVar15);
            operator_new(0x30);
            local_1441 = 1;
            local_350 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ::lower((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                 *)CONCAT44(in_stack_ffffffffffffe704,in_stack_ffffffffffffe700),
                                in_stack_ffffffffffffe6fc);
            local_348 = local_1430;
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                      ((cpp_dec_float<50U,_int,_void> *)
                       CONCAT44(in_stack_ffffffffffffe704,in_stack_ffffffffffffe700),
                       (cpp_dec_float<50U,_int,_void> *)
                       CONCAT44(in_stack_ffffffffffffe6fc,in_stack_ffffffffffffe6f8));
            std::shared_ptr<soplex::Tolerances>::shared_ptr
                      ((shared_ptr<soplex::Tolerances> *)
                       CONCAT44(in_stack_ffffffffffffe704,in_stack_ffffffffffffe700),
                       (shared_ptr<soplex::Tolerances> *)
                       CONCAT44(in_stack_ffffffffffffe6fc,in_stack_ffffffffffffe6f8));
            FixBoundsPS::FixBoundsPS
                      (in_stack_ffffffffffffea60,
                       (SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        *)CONCAT17(in_stack_ffffffffffffea5f,in_stack_ffffffffffffea58),
                       (int)((ulong)in_stack_ffffffffffffea50 >> 0x20),
                       (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)CONCAT44(in_stack_ffffffffffffea4c,iVar7),
                       (shared_ptr<soplex::Tolerances> *)CONCAT44(iVar6,in_stack_ffffffffffffea40));
            local_1441 = 0;
            std::
            shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>::PostStep>
            ::
            shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>::FixBoundsPS,void>
                      ((shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>
                        *)CONCAT44(in_stack_ffffffffffffe704,in_stack_ffffffffffffe700),
                       (FixBoundsPS *)CONCAT44(in_stack_ffffffffffffe6fc,in_stack_ffffffffffffe6f8))
            ;
            std::shared_ptr<soplex::Tolerances>::~shared_ptr
                      ((shared_ptr<soplex::Tolerances> *)0x3d9c12);
            Array<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>
            ::append((Array<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>
                      *)CONCAT44(in_stack_ffffffffffffe704,in_stack_ffffffffffffe700),
                     (shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>
                      *)CONCAT44(in_stack_ffffffffffffe6fc,in_stack_ffffffffffffe6f8));
            pnVar15 = local_6d8;
            iVar9 = local_e44;
            pnVar16 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ::lower((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               *)CONCAT44(in_stack_ffffffffffffe704,in_stack_ffffffffffffe700),
                              in_stack_ffffffffffffe6fc);
            (**(code **)(*(long *)(pnVar15->m_backend).data._M_elems + 0x168))
                      (pnVar15,iVar9,pnVar16,0);
            piVar13 = DataArray<int>::operator[](&in_RDI->m_stat,0xb);
            *piVar13 = *piVar13 + 1;
            std::
            shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>
            ::~shared_ptr((shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>
                           *)0x3d9ca5);
          }
        }
        else {
          pnVar15 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                  *)CONCAT44(in_stack_ffffffffffffe704,in_stack_ffffffffffffe700),
                                 in_stack_ffffffffffffe6fc);
          SPxOut::
          debug<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_const_char_(&)[66],_int_&,_boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_&,_boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_&,_0>
                    (in_RDI,(char (*) [66])
                            "IMAISM49 col {}: weakly dominated -> maxObj={} dual rhs bound={}\n",
                     &local_e44,&local_f28,pnVar15);
          operator_new(0x30);
          local_12f9 = 1;
          in_stack_ffffffffffffe7e8 = local_6d8;
          in_stack_ffffffffffffe7f4 = local_e44;
          local_380 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ::upper((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               *)CONCAT44(in_stack_ffffffffffffe704,in_stack_ffffffffffffe700),
                              in_stack_ffffffffffffe6fc);
          local_378 = local_12f8[0].m_backend.data._M_elems + 4;
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                    ((cpp_dec_float<50U,_int,_void> *)
                     CONCAT44(in_stack_ffffffffffffe704,in_stack_ffffffffffffe700),
                     (cpp_dec_float<50U,_int,_void> *)
                     CONCAT44(in_stack_ffffffffffffe6fc,in_stack_ffffffffffffe6f8));
          in_stack_ffffffffffffe7e0 = local_12f8;
          std::shared_ptr<soplex::Tolerances>::shared_ptr
                    ((shared_ptr<soplex::Tolerances> *)
                     CONCAT44(in_stack_ffffffffffffe704,in_stack_ffffffffffffe700),
                     (shared_ptr<soplex::Tolerances> *)
                     CONCAT44(in_stack_ffffffffffffe6fc,in_stack_ffffffffffffe6f8));
          FixBoundsPS::FixBoundsPS
                    (in_stack_ffffffffffffea60,
                     (SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      *)CONCAT17(in_stack_ffffffffffffea5f,in_stack_ffffffffffffea58),
                     (int)((ulong)in_stack_ffffffffffffea50 >> 0x20),
                     (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)CONCAT44(in_stack_ffffffffffffea4c,iVar7),
                     (shared_ptr<soplex::Tolerances> *)CONCAT44(iVar6,in_stack_ffffffffffffea40));
          local_12f9 = 0;
          std::
          shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>::PostStep>
          ::
          shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>::FixBoundsPS,void>
                    ((shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>
                      *)CONCAT44(in_stack_ffffffffffffe704,in_stack_ffffffffffffe700),
                     (FixBoundsPS *)CONCAT44(in_stack_ffffffffffffe6fc,in_stack_ffffffffffffe6f8));
          std::shared_ptr<soplex::Tolerances>::~shared_ptr
                    ((shared_ptr<soplex::Tolerances> *)0x3d980a);
          Array<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>
          ::append((Array<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>
                    *)CONCAT44(in_stack_ffffffffffffe704,in_stack_ffffffffffffe700),
                   (shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>
                    *)CONCAT44(in_stack_ffffffffffffe6fc,in_stack_ffffffffffffe6f8));
          iVar9 = local_e44;
          in_stack_ffffffffffffe7c0 = local_6d8;
          pnVar15 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ::upper((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                             *)CONCAT44(in_stack_ffffffffffffe704,in_stack_ffffffffffffe700),
                            in_stack_ffffffffffffe6fc);
          (**(code **)(*(long *)(in_stack_ffffffffffffe7c0->m_backend).data._M_elems + 0x150))
                    (in_stack_ffffffffffffe7c0,iVar9,pnVar15,0);
          piVar13 = DataArray<int>::operator[](&in_RDI->m_stat,0xb);
          *piVar13 = *piVar13 + 1;
          std::
          shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>
          ::~shared_ptr((shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>
                         *)0x3d98a9);
        }
      }
    }
    local_340 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::lower((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         *)CONCAT44(in_stack_ffffffffffffe704,in_stack_ffffffffffffe700),
                        in_stack_ffffffffffffe6fc);
    local_338 = local_147c;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
              ((cpp_dec_float<50U,_int,_void> *)
               CONCAT44(in_stack_ffffffffffffe704,in_stack_ffffffffffffe700),
               (cpp_dec_float<50U,_int,_void> *)
               CONCAT44(in_stack_ffffffffffffe6fc,in_stack_ffffffffffffe6f8));
    local_330 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::upper((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         *)CONCAT44(in_stack_ffffffffffffe704,in_stack_ffffffffffffe700),
                        in_stack_ffffffffffffe6fc);
    local_328 = local_14b4;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
              ((cpp_dec_float<50U,_int,_void> *)
               CONCAT44(in_stack_ffffffffffffe704,in_stack_ffffffffffffe700),
               (cpp_dec_float<50U,_int,_void> *)
               CONCAT44(in_stack_ffffffffffffe6fc,in_stack_ffffffffffffe6f8));
    feastol(in_stack_ffffffffffffe738);
    bVar5 = EQrel<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                      ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)CONCAT44(in_stack_ffffffffffffe7f4,in_stack_ffffffffffffe7f0),
                       in_stack_ffffffffffffe7e8,in_stack_ffffffffffffe7e0);
    uVar3 = _local_1160;
    if (bVar5) {
      uVar2 = (uint)_local_1160 >> 0x18;
      fixColumn(in_stack_ffffffffffffeeb0,in_stack_ffffffffffffeea8,in_stack_ffffffffffffeea4,
                SUB41(uVar2,0));
      _local_1160 = uVar3;
      local_6e8 = local_6e8 + 1;
      pSVar12 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::colVector((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                             *)CONCAT44(in_stack_ffffffffffffe704,in_stack_ffffffffffffe700),
                            in_stack_ffffffffffffe6fc);
      iVar9 = SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::size(pSVar12);
      local_6ec = local_6ec + iVar9;
      removeCol(in_stack_ffffffffffffe710,in_stack_ffffffffffffe708,in_stack_ffffffffffffe704);
      piVar13 = DataArray<int>::operator[](&in_RDI->m_stat,5);
      *piVar13 = *piVar13 + 1;
    }
  } while( true );
}

Assistant:

typename SPxSimplifier<R>::Result SPxMainSM<R>::simplifyDual(SPxLPBase<R>& lp, bool& again)
{

   // This method simplifies LP using the following dual structures:
   //
   // 1. dominated columns
   // 2. weakly dominated columns
   //
   // For constructing the dual variables, it is assumed that the objective sense is max

   int remRows = 0;
   int remCols = 0;
   int remNzos = 0;

   int oldRows = lp.nRows();
   int oldCols = lp.nCols();

   DataArray<bool> colSingleton(lp.nCols());
   VectorBase<R>         dualVarLo(lp.nRows());
   VectorBase<R>         dualVarUp(lp.nRows());
   VectorBase<R>         dualConsLo(lp.nCols());
   VectorBase<R>         dualConsUp(lp.nCols());

   // init
   for(int i = lp.nRows() - 1; i >= 0; --i)
   {
      // check for unconstrained constraints
      if(lp.lhs(i) <= R(-infinity) && lp.rhs(i) >= R(infinity))
      {
         SPxOut::debug(this, "IMAISM43 row {}: unconstrained\n", i);

         std::shared_ptr<PostStep> ptr(new FreeConstraintPS(lp, i, this->_tolerances));
         m_hist.append(ptr);

         ++remRows;
         remNzos += lp.rowVector(i).size();
         removeRow(lp, i);

         ++m_stat[FREE_ROW];

         continue;
      }

      // corresponds to maximization sense
      dualVarLo[i] = (lp.lhs(i) <= R(-infinity)) ? 0.0 : R(-infinity);
      dualVarUp[i] = (lp.rhs(i) >=  R(infinity)) ? 0.0 :  R(infinity);
   }

   // compute bounds on the dual variables using column singletons
   for(int j = 0; j < lp.nCols(); ++j)
   {
      if(lp.colVector(j).size() == 1)
      {
         int  i   = lp.colVector(j).index(0);
         R aij = lp.colVector(j).value(0);

         SOPLEX_ASSERT_WARN("WMAISM44", isNotZero(aij, R(1.0 / R(infinity))));

         R bound = lp.maxObj(j) / aij;

         if(aij > 0)
         {
            if(lp.lower(j) <= R(-infinity) && bound < dualVarUp[i])
               dualVarUp[i] = bound;

            if(lp.upper(j) >=  R(infinity) && bound > dualVarLo[i])
               dualVarLo[i] = bound;
         }
         else if(aij < 0)
         {
            if(lp.lower(j) <= R(-infinity) && bound > dualVarLo[i])
               dualVarLo[i] = bound;

            if(lp.upper(j) >=  R(infinity) && bound < dualVarUp[i])
               dualVarUp[i] = bound;
         }
      }

   }

   // compute bounds on the dual constraints
   for(int j = 0; j < lp.nCols(); ++j)
   {
      dualConsLo[j] = dualConsUp[j] = 0.0;

      const SVectorBase<R>& col = lp.colVector(j);

      for(int k = 0; k < col.size(); ++k)
      {
         if(dualConsLo[j] <= R(-infinity) && dualConsUp[j] >= R(infinity))
            break;

         R aij = col.value(k);
         int  i   = col.index(k);

         SOPLEX_ASSERT_WARN("WMAISM45", isNotZero(aij, R(1.0 / R(infinity))));

         if(aij > 0)
         {
            if(dualVarLo[i] <= R(-infinity))
               dualConsLo[j] = R(-infinity);
            else
               dualConsLo[j] += aij * dualVarLo[i];

            if(dualVarUp[i] >= R(infinity))
               dualConsUp[j] = R(infinity);
            else
               dualConsUp[j] += aij * dualVarUp[i];
         }
         else if(aij < 0)
         {
            if(dualVarLo[i] <= R(-infinity))
               dualConsUp[j] = R(infinity);
            else
               dualConsUp[j] += aij * dualVarLo[i];

            if(dualVarUp[i] >= R(infinity))
               dualConsLo[j] = R(-infinity);
            else
               dualConsLo[j] += aij * dualVarUp[i];
         }
      }
   }

   for(int j = lp.nCols() - 1; j >= 0; --j)
   {
      if(lp.colVector(j).size() <= 1)
         continue;

      // dual infeasibility checks
      if(LTrel(dualConsUp[j], dualConsLo[j], opttol()))
      {
         SPxOut::debug(this, "IMAISM46 col {}: dual infeasible -> dual lhs bound={} dual rhs bound={}\n", j,
                       dualConsLo[j], dualConsUp[j]);
         return this->DUAL_INFEASIBLE;
      }

      R obj = lp.maxObj(j);

      // 1. dominated column
      // Is the problem really unbounded in the cases below ??? Or is only dual infeasibility be shown
      if(GTrel(obj, dualConsUp[j], opttol()))
      {
#if SOPLEX_DOMINATED_COLUMN
         SPxOut::debug(this, "IMAISM47 col{}: dominated -> maxObj={} dual rhs bound={}\n", j, obj,
                       dualConsUp[j]);

         if(lp.upper(j) >= R(infinity))
         {
            SPX_MSG_INFO2((*this->spxout), (*this->spxout) << " unbounded" << std::endl;)
            return this->UNBOUNDED;
         }

         SPxOut::debug(this, " fixed at upper={}\n", lp.upper(j));

         std::shared_ptr<PostStep> ptr(new FixBoundsPS(lp, j, lp.upper(j), this->_tolerances));
         m_hist.append(ptr);
         lp.changeLower(j, lp.upper(j));

         ++m_stat[DOMINATED_COL];
#endif
      }
      else if(LTrel(obj, dualConsLo[j], opttol()))
      {
#if SOPLEX_DOMINATED_COLUMN
         SPxOut::debug(this, "IMAISM48 col {}: dominated -> maxObj={} dual lhs bound={}\n", j, obj,
                       dualConsLo[j]);

         if(lp.lower(j) <= R(-infinity))
         {
            SPX_MSG_INFO2((*this->spxout), (*this->spxout) << " unbounded" << std::endl;)
            return this->UNBOUNDED;
         }

         SPxOut::debug(this, " fixed at lower={}\n", lp.lower(j));

         std::shared_ptr<PostStep> ptr(new FixBoundsPS(lp, j, lp.lower(j), this->_tolerances));
         m_hist.append(ptr);
         lp.changeUpper(j, lp.lower(j));

         ++m_stat[DOMINATED_COL];
#endif
      }

      // 2. weakly dominated column (no postsolving)
      else if(lp.upper(j) < R(infinity) && EQrel(obj, dualConsUp[j], opttol()))
      {
#if SOPLEX_WEAKLY_DOMINATED_COLUMN
         SPxOut::debug(this, "IMAISM49 col {}: weakly dominated -> maxObj={} dual rhs bound={}\n", j, obj,
                       dualConsUp[j]);

         std::shared_ptr<PostStep> ptr(new FixBoundsPS(lp, j, lp.upper(j), this->_tolerances));
         m_hist.append(ptr);
         lp.changeLower(j, lp.upper(j));

         ++m_stat[WEAKLY_DOMINATED_COL];
#endif
      }
      else if(lp.lower(j) > R(-infinity) && EQrel(obj, dualConsLo[j], opttol()))
      {
#if SOPLEX_WEAKLY_DOMINATED_COLUMN
         SPxOut::debug(this, "IMAISM50 col {}: weakly dominated -> maxObj={} dual lhs bound={}\n", j, obj,
                       dualConsLo[j]);

         std::shared_ptr<PostStep> ptr(new FixBoundsPS(lp, j, lp.lower(j), this->_tolerances));
         m_hist.append(ptr);
         lp.changeUpper(j, lp.lower(j));

         ++m_stat[WEAKLY_DOMINATED_COL];
#endif
      }

      // fix column
      if(EQrel(lp.lower(j), lp.upper(j), feastol()))
      {
#if SOPLEX_FIX_VARIABLE
         fixColumn(lp, j);

         ++remCols;
         remNzos += lp.colVector(j).size();
         removeCol(lp, j);

         ++m_stat[FIX_COL];
#endif
      }
   }


   assert(remRows > 0 || remCols > 0 || remNzos == 0);

   if(remCols + remRows > 0)
   {
      this->m_remRows += remRows;
      this->m_remCols += remCols;
      this->m_remNzos += remNzos;

      SPX_MSG_INFO2((*this->spxout), (*this->spxout) << "Simplifier (dual) removed "
                    << remRows << " rows, "
                    << remCols << " cols, "
                    << remNzos << " non-zeros"
                    << std::endl;)

      if(remCols + remRows > this->m_minReduction * (oldCols + oldRows))
         again = true;
   }

   return this->OKAY;
}